

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O0

Var mapVar(Var x,vec<int> *map,Var *max)

{
  int iVar1;
  int *piVar2;
  int *in_RDX;
  vec<int> *in_RSI;
  int in_EDI;
  undefined4 in_stack_ffffffffffffffe0;
  
  iVar1 = Glucose::vec<int>::size(in_RSI);
  if (in_EDI < iVar1) {
    piVar2 = Glucose::vec<int>::operator[](in_RSI,in_EDI);
    if (*piVar2 != -1) goto LAB_0011ac57;
  }
  Glucose::vec<int>::growTo
            (in_RSI,(int)((ulong)in_RDX >> 0x20),
             (int *)CONCAT44(0xffffffff,in_stack_ffffffffffffffe0));
  iVar1 = *in_RDX;
  *in_RDX = iVar1 + 1;
  piVar2 = Glucose::vec<int>::operator[](in_RSI,in_EDI);
  *piVar2 = iVar1;
LAB_0011ac57:
  piVar2 = Glucose::vec<int>::operator[](in_RSI,in_EDI);
  return *piVar2;
}

Assistant:

static Var mapVar(Var x, vec <Var> &map, Var &max) {
    if(map.size() <= x || map[x] == -1) {
        map.growTo(x + 1, -1);
        map[x] = max++;
    }
    return map[x];
}